

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void initEmptyMultiBox(QList<QLayoutStruct> *chain,int start,int end)

{
  int in_EDX;
  int in_ESI;
  QLayoutStruct *data;
  int i;
  qsizetype in_stack_ffffffffffffffd8;
  reference in_stack_ffffffffffffffe0;
  int local_14;
  
  for (local_14 = in_ESI; local_14 <= in_EDX; local_14 = local_14 + 1) {
    in_stack_ffffffffffffffe0 =
         QList<QLayoutStruct>::operator[]
                   ((QList<QLayoutStruct> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (((in_stack_ffffffffffffffe0->empty & 1U) != 0) &&
       (in_stack_ffffffffffffffe0->maximumSize == 0)) {
      in_stack_ffffffffffffffe0->maximumSize = 0xffffff;
    }
    in_stack_ffffffffffffffe0->empty = false;
  }
  return;
}

Assistant:

static void initEmptyMultiBox(QList<QLayoutStruct> &chain, int start, int end)
{
    for (int i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        if (data->empty && data->maximumSize == 0) // truly empty box
            data->maximumSize = QWIDGETSIZE_MAX;
        data->empty = false;
    }
}